

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::strings_internal::
Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
::operator()(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,
            ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
            *this,Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *splitter)

{
  bool bVar1;
  pointer pvVar2;
  const_pointer pvVar3;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  iterator __first;
  iterator pvVar7;
  byte local_199;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_170;
  const_iterator local_168;
  size_type local_160;
  size_t index;
  const_iterator it;
  array<raw_view,_16UL> ar;
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *splitter_local;
  ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
  *this_local;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *v;
  
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__);
  Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>::
  begin((const_iterator *)&index,splitter);
  while (bVar1 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::at_end((SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)&index), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_160 = 0;
    do {
      pvVar2 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator->((SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)&index);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(pvVar2);
      pvVar4 = std::array<raw_view,_16UL>::operator[]
                         ((array<raw_view,_16UL> *)&it.delimiter_,local_160);
      pvVar4->data = pvVar3;
      pvVar2 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator->((SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)&index);
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pvVar2);
      pvVar4 = std::array<raw_view,_16UL>::operator[]
                         ((array<raw_view,_16UL> *)&it.delimiter_,local_160);
      pvVar4->size = sVar5;
      SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator++((SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)&index);
      sVar5 = local_160 + 1;
      local_160 = sVar5;
      sVar6 = std::
              array<absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>::ConvertToContainer<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::basic_string_view<char,std::char_traits<char>>,false>::TEMPNAMEPLACEHOLDERVALUE(absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>const&)const::raw_view,16ul>
              ::operator()((array<absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>::ConvertToContainer<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::basic_string_view<char,std::char_traits<char>>,false>::TEMPNAMEPLACEHOLDERVALUE(absl::strings_internal::Splitter<absl::ByChar,absl::AllowEmpty,std::basic_string_view<char,std::char_traits<char>>>const&)const::raw_view,16ul>
                            *)&it.delimiter_);
      local_199 = 0;
      if (sVar5 != sVar6) {
        bVar1 = SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::at_end((SplitIterator<absl::strings_internal::Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&index);
        local_199 = bVar1 ^ 0xff;
      }
    } while ((local_199 & 1) != 0);
    local_170._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
    ::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*>
              ((__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                *)&local_168,&local_170);
    __first = std::array<raw_view,_16UL>::begin((array<raw_view,_16UL> *)&it.delimiter_);
    pvVar7 = std::array<raw_view,_16UL>::begin((array<raw_view,_16UL> *)&it.delimiter_);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::operator()((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,local_168,__first,pvVar7 + local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<absl::string_view, A> operator()(
        const Splitter& splitter) const {
      struct raw_view {
        const char* data;
        size_t size;
        operator absl::string_view() const {  // NOLINT(runtime/explicit)
          return {data, size};
        }
      };
      std::vector<absl::string_view, A> v;
      std::array<raw_view, 16> ar;
      for (auto it = splitter.begin(); !it.at_end();) {
        size_t index = 0;
        do {
          ar[index].data = it->data();
          ar[index].size = it->size();
          ++it;
        } while (++index != ar.size() && !it.at_end());
        // We static_cast index to a signed type to work around overzealous
        // compiler warnings about signedness.
        v.insert(v.end(), ar.begin(),
                 ar.begin() + static_cast<ptrdiff_t>(index));
      }
      return v;
    }